

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbordevice.h
# Opt level: O0

void __thiscall CborDevice::putChar(CborDevice *this,char c)

{
  byte in_SIL;
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  putNewline((CborDevice *)CONCAT17(in_SIL,in_stack_fffffffffffffff0));
  if (in_SIL < 0x20) {
    fprintf((FILE *)*in_RDI," \'\\x%x\',",(ulong)in_SIL);
  }
  else if (in_SIL < 0x7f) {
    if ((in_SIL == 0x27) || (in_SIL == 0x5c)) {
      fprintf((FILE *)*in_RDI," \'\\%c\',",(ulong)(uint)(int)(char)in_SIL);
    }
    else {
      fprintf((FILE *)*in_RDI," \'%c\', ",(ulong)(uint)(int)(char)in_SIL);
    }
  }
  else {
    fprintf((FILE *)*in_RDI," uchar(\'\\x%x\'),",(ulong)in_SIL);
  }
  return;
}

Assistant:

void putChar(char c)
    {
        putNewline();
        if (uchar(c) < 0x20)
            fprintf(out, " '\\x%x',", uint8_t(c));
        else if (uchar(c) >= 0x7f)
            fprintf(out, " uchar('\\x%x'),", uint8_t(c));
        else if (c == '\'' || c == '\\')
            fprintf(out, " '\\%c',", c);
        else
            fprintf(out, " '%c', ", c);
    }